

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O2

char * basicgetobjname(Proto *p,int *ppc,int reg,char **name)

{
  uint uVar1;
  Instruction *pIVar2;
  long lVar3;
  int iVar4;
  char *pcVar5;
  TValue *pTVar6;
  uint uVar7;
  ulong uVar8;
  int pc;
  ulong uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  char *local_40;
  
  pc = *ppc;
LAB_00108c63:
  pcVar5 = luaF_getlocalname(p,reg + 1,pc);
  *name = pcVar5;
  if (pcVar5 != (char *)0x0) {
    local_40 = "local";
    return local_40;
  }
  pIVar2 = p->code;
  uVar7 = ((char)"\b\n\n\t\t\b\b\b\b\b"[pIVar2[pc] & 0x7f] >> 7) + pc;
  uVar8 = 0;
  uVar9 = 0;
  if (0 < (int)uVar7) {
    uVar9 = (ulong)uVar7;
  }
  iVar10 = 0;
  pc = -1;
  for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
    uVar1 = pIVar2[uVar8];
    uVar13 = uVar1 & 0x7f;
    uVar12 = uVar1 >> 7 & 0xff;
    if (uVar13 - 0x44 < 2) {
LAB_00108d22:
      if ((int)uVar12 <= reg) {
LAB_00108d38:
        pc = (int)uVar8;
        if ((long)uVar8 < (long)iVar10) {
          pc = -1;
        }
      }
    }
    else {
      if (uVar13 == 0x4c) {
        uVar12 = uVar12 + 2;
        goto LAB_00108d22;
      }
      if (uVar13 != 0x38) {
        if (uVar13 == 8) {
          if (((int)uVar12 <= reg) && ((uint)reg <= uVar12 + (uVar1 >> 0x10 & 0xff)))
          goto LAB_00108d38;
          goto LAB_00108d43;
        }
        if ((uVar12 != reg) || (("\b\n\n\t\t\b\b\b\b\b"[uVar13] & 8) == 0)) goto LAB_00108d43;
        goto LAB_00108d38;
      }
      iVar11 = (uVar1 >> 7) + (int)uVar8 + -0xfffffe;
      iVar4 = iVar10;
      if (iVar10 < iVar11) {
        iVar4 = iVar11;
      }
      if (iVar11 <= (int)uVar7) {
        iVar10 = iVar4;
      }
    }
LAB_00108d43:
  }
  *ppc = pc;
  if (pc == -1) {
    return (char *)0x0;
  }
  uVar7 = pIVar2[pc];
  switch(uVar7 & 0x7f) {
  case 0:
    goto switchD_00108d7a_caseD_0;
  default:
    return (char *)0x0;
  case 3:
    pTVar6 = p->k;
    uVar7 = uVar7 >> 0xb;
    break;
  case 4:
    pTVar6 = p->k;
    uVar7 = pIVar2[(long)pc + 1] >> 3;
    break;
  case 9:
    lVar3 = *(long *)((long)&p->upvalues->name + (ulong)(uVar7 >> 0xc & 0xff0));
    pcVar5 = "?";
    if (lVar3 != 0) {
      pcVar5 = (char *)(lVar3 + 0x18);
    }
    local_40 = "upvalue";
    goto LAB_00108e23;
  }
  if (((&pTVar6->tt_)[uVar7 & 0xfffffff0] & 0xf) == 4) {
    pcVar5 = (char *)(*(long *)((long)&pTVar6->value_ + (ulong)(uVar7 & 0xfffffff0)) + 0x18);
    local_40 = "constant";
  }
  else {
    pcVar5 = "?";
    local_40 = (char *)0x0;
  }
LAB_00108e23:
  *name = pcVar5;
  return local_40;
switchD_00108d7a_caseD_0:
  reg = uVar7 >> 0x10 & 0xff;
  if ((uVar7 >> 7 & 0xff) <= (uint)reg) {
    return (char *)0x0;
  }
  goto LAB_00108c63;
}

Assistant:

static const char *basicgetobjname (const Proto *p, int *ppc, int reg,
                                    const char **name) {
  int pc = *ppc;
  *name = luaF_getlocalname(p, reg + 1, pc);
  if (*name)  /* is a local? */
    return "local";
  /* else try symbolic execution */
  *ppc = pc = findsetreg(p, pc, reg);
  if (pc != -1) {  /* could find instruction? */
    Instruction i = p->code[pc];
    OpCode op = GET_OPCODE(i);
    switch (op) {
      case OP_MOVE: {
        int b = GETARG_B(i);  /* move from 'b' to 'a' */
        if (b < GETARG_A(i))
          return basicgetobjname(p, ppc, b, name);  /* get name for 'b' */
        break;
      }
      case OP_GETUPVAL: {
        *name = upvalname(p, GETARG_B(i));
        return "upvalue";
      }
      case OP_LOADK: return kname(p, GETARG_Bx(i), name);
      case OP_LOADKX: return kname(p, GETARG_Ax(p->code[pc + 1]), name);
      default: break;
    }
  }
  return NULL;  /* could not find reasonable name */
}